

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcAnd.c
# Opt level: O3

void Bmc_MnaBuild(Gia_Man_t *p,Vec_Int_t *vCos,Vec_Int_t *vNodes,Gia_Man_t *pNew,Vec_Int_t *vMap,
                 Vec_Int_t *vPiMap)

{
  Gia_Obj_t *pGVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  Gia_Obj_t *pGVar5;
  long lVar6;
  uint uVar7;
  
  if (vCos->nSize < 1) {
    pGVar5 = p->pObjs;
  }
  else {
    lVar6 = 0;
    do {
      lVar4 = (long)vCos->pArray[lVar6];
      if ((lVar4 < 0) || (p->nObjs <= vCos->pArray[lVar6])) goto LAB_00517753;
      uVar3 = (uint)*(undefined8 *)(p->pObjs + lVar4);
      if ((-1 < (int)uVar3) || (uVar3 = uVar3 & 0x1fffffff, uVar3 == 0x1fffffff)) {
        __assert_fail("Gia_ObjIsCo(pObj)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcBmcAnd.c"
                      ,0x106,
                      "void Bmc_MnaBuild(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Gia_Man_t *, Vec_Int_t *, Vec_Int_t *)"
                     );
      }
      pGVar1 = p->pObjs + lVar4;
      Bmc_MnaBuild_rec(p,pGVar1 + -(ulong)uVar3,pNew,vMap,vPiMap);
      pGVar5 = p->pObjs;
      if ((pGVar1 < pGVar5) || (pGVar5 + p->nObjs <= pGVar1)) {
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      uVar3 = (int)((long)pGVar1 - (long)pGVar5 >> 2) * -0x55555555;
      uVar7 = uVar3 - (*(uint *)pGVar1 & 0x1fffffff);
      if (((int)uVar7 < 0) || (vMap->nSize <= (int)uVar7)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar7 = vMap->pArray[uVar7];
      if ((int)uVar7 < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                      ,0xf5,"int Abc_LitNotCond(int, int)");
      }
      if (((int)uVar3 < 0) || ((uint)vMap->nSize <= uVar3)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      vMap->pArray[uVar3 & 0x7fffffff] = uVar7 ^ *(uint *)pGVar1 >> 0x1d & 1;
      lVar6 = lVar6 + 1;
    } while (lVar6 < vCos->nSize);
  }
  pGVar5->field_0x7 = pGVar5->field_0x7 & 0x7f;
  if (0 < vNodes->nSize) {
    lVar6 = 0;
    do {
      iVar2 = vNodes->pArray[lVar6];
      if (((long)iVar2 < 0) || (p->nObjs <= iVar2)) {
LAB_00517753:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) {
        return;
      }
      pGVar5 = p->pObjs + iVar2;
      *(ulong *)pGVar5 = *(ulong *)pGVar5 & 0x7fffffffffffffff;
      lVar6 = lVar6 + 1;
    } while (lVar6 < vNodes->nSize);
  }
  return;
}

Assistant:

void Bmc_MnaBuild( Gia_Man_t * p, Vec_Int_t * vCos, Vec_Int_t * vNodes, Gia_Man_t * pNew, Vec_Int_t * vMap, Vec_Int_t * vPiMap )
{
    Gia_Obj_t * pObj;
    int i, iLit;
    Gia_ManForEachObjVec( vCos, p, pObj, i )
    {
        assert( Gia_ObjIsCo(pObj) );
        Bmc_MnaBuild_rec( p, Gia_ObjFanin0(pObj), pNew, vMap, vPiMap );
        iLit = Abc_LitNotCond( Vec_IntEntry(vMap, Gia_ObjFaninId0p(p, pObj)), Gia_ObjFaninC0(pObj) );
        Vec_IntWriteEntry( vMap, Gia_ObjId(p, pObj), iLit );
    }
    Gia_ManConst0(p)->fPhase = 0;
    Gia_ManForEachObjVec( vNodes, p, pObj, i )
        pObj->fPhase = 0;
}